

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O2

BOOL __thiscall Js::RecyclableObject::SkipsPrototype(RecyclableObject *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  uVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x5c])();
  uVar4 = *(uint *)&((this->type).ptr)->flags >> 4 & 1;
  if (uVar3 != uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x101,
                                "(this->DbgSkipsPrototype() == this->GetType()->SkipsPrototype())",
                                "this->DbgSkipsPrototype() == this->GetType()->SkipsPrototype()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    uVar4 = *(uint *)&((this->type).ptr)->flags >> 4 & 1;
  }
  return uVar4;
}

Assistant:

BOOL RecyclableObject::SkipsPrototype() const
    {
        Assert(this->DbgSkipsPrototype() == this->GetType()->SkipsPrototype());
        return this->GetType()->SkipsPrototype();
    }